

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  byte *pbVar6;
  ulong uVar5;
  
  pbVar1 = *p;
  iVar2 = -0x60;
  if (0 < (long)end - (long)pbVar1) {
    if ((char)*pbVar1 < '\0') {
      uVar4 = *pbVar1 & 0x7f;
      uVar5 = (ulong)uVar4;
      if ((byte)((char)uVar4 - 5U) < 0xfc) {
        return -100;
      }
      if ((ulong)((long)end - (long)pbVar1) <= uVar5) {
        return -0x60;
      }
      *len = 0;
      pbVar6 = pbVar1 + 1;
      *p = pbVar6;
      uVar3 = 0;
      do {
        uVar3 = uVar3 << 8 | (ulong)*pbVar6;
        pbVar6 = pbVar6 + 1;
        *len = uVar3;
        *p = pbVar6;
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    else {
      pbVar6 = pbVar1 + 1;
      *p = pbVar6;
      uVar3 = (ulong)*pbVar1;
      *len = uVar3;
    }
    iVar2 = -0x60;
    if (uVar3 <= (ulong)((long)end - (long)pbVar6)) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_len(unsigned char **p,
                         const unsigned char *end,
                         size_t *len)
{
    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    if ((**p & 0x80) == 0) {
        *len = *(*p)++;
    } else {
        int n = (**p) & 0x7F;
        if (n == 0 || n > 4) {
            return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
        }
        if ((end - *p) <= n) {
            return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
        }
        *len = 0;
        (*p)++;
        while (n--) {
            *len = (*len << 8) | **p;
            (*p)++;
        }
    }

    if (*len > (size_t) (end - *p)) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return 0;
}